

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_paramtype.cc
# Opt level: O1

void __thiscall
ParameterizedType::DoGenParseCode
          (ParameterizedType *this,Output *out_cc,Env *env,DataPtr *data,int flags)

{
  pointer pcVar1;
  Output *this_00;
  bool bVar2;
  int iVar3;
  Type *this_01;
  char *pcVar4;
  ID *pIVar5;
  _Alloc_hider _Var6;
  char *pcVar7;
  string call_parse_func;
  string parse_params;
  string local_78;
  Output *local_58;
  undefined1 *local_50;
  char *local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_58 = out_cc;
  if (FLAGS_pac_debug) {
    DoGenParseCode(this);
  }
  this_01 = ReferredDataType(this,true);
  local_50 = &local_40;
  local_48 = (char *)0x0;
  local_40 = 0;
  iVar3 = (*(this->super_Type).super_DataDepElement._vptr_DataDepElement[0x16])(this);
  if (iVar3 == 1) {
    std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x133058);
LAB_0012226f:
    pcVar7 = "Parse";
  }
  else {
    if (this_01->incremental_input_ != true) {
      pcVar1 = (data->ptr_expr_)._M_dataplus._M_p;
      pcVar7 = Env::RValue(env,end_of_data);
      strfmt_abi_cxx11_(&local_78,"%s, %s",pcVar1,pcVar7);
      std::__cxx11::string::operator=((string *)&local_50,(string *)&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0012226f;
    }
    pcVar4 = Env::RValue(env,flow_buffer_id);
    pcVar7 = local_48;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)&local_50,0,pcVar7,(ulong)pcVar4);
    pcVar7 = "ParseBuffer";
  }
  bVar2 = ::RequiresAnalyzerContext::compute(&this_01->super_DataDepElement);
  if (bVar2) {
    pcVar4 = Env::RValue(env,analyzer_context_id);
    strfmt_abi_cxx11_(&local_78,", %s",pcVar4);
    std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_78._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  bVar2 = Type::RequiresByteOrder(this_01);
  if (bVar2) {
    Env::Evaluate(env,local_58,byteorder_id);
    pcVar4 = Env::RValue(env,byteorder_id);
    strfmt_abi_cxx11_(&local_78,", %s",pcVar4);
    std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_78._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  strfmt_abi_cxx11_(&local_78,"%s->%s(%s)",(this->super_Type).lvalue_._M_dataplus._M_p,pcVar7,
                    local_50);
  this_00 = local_58;
  if ((this->super_Type).incremental_input_ == true) {
    iVar3 = (*(this->super_Type).super_DataDepElement._vptr_DataDepElement[0x16])(this);
    if (iVar3 != 1) {
      pIVar5 = Type::parsing_complete_var(&this->super_Type);
      pcVar7 = Env::LValue(env,pIVar5);
      Output::println(this_00,"%s = %s;",pcVar7,local_78._M_dataplus._M_p);
      pIVar5 = Type::parsing_complete_var(&this->super_Type);
      bVar2 = Env::Evaluated(env,pIVar5);
      if (bVar2) goto LAB_0012247d;
      pIVar5 = Type::parsing_complete_var(&this->super_Type);
LAB_00122456:
      Env::SetEvaluated(env,pIVar5,true);
      goto LAB_0012247d;
    }
    Output::println(this_00,"%s;",local_78._M_dataplus._M_p);
    pIVar5 = Type::parsing_complete_var(&this->super_Type);
    _Var6._M_p = Env::LValue(env,pIVar5);
    pcVar7 = "%s = true;";
  }
  else {
    bVar2 = Type::AddSizeVar(&this->super_Type,local_58,env);
    if (bVar2) {
      pIVar5 = Type::size_var(&this->super_Type);
      pcVar7 = Env::LValue(env,pIVar5);
      Output::println(this_00,"%s = %s;",pcVar7,local_78._M_dataplus._M_p);
      pIVar5 = Type::size_var(&this->super_Type);
      goto LAB_00122456;
    }
    pcVar7 = "%s;";
    _Var6._M_p = local_78._M_dataplus._M_p;
  }
  Output::println(this_00,pcVar7,_Var6._M_p);
LAB_0012247d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return;
}

Assistant:

void ParameterizedType::DoGenParseCode(Output* out_cc, Env* env, const DataPtr& data, int flags)
	{
	DEBUG_MSG("DoGenParseCode for %s\n", type_id_->Name());

	Type* ref_type = ReferredDataType(true);

	const char* parse_func;
	string parse_params;

	if ( buffer_mode() == BUFFER_NOTHING )
		{
		ASSERT(! ref_type->incremental_input());
		parse_func = kParseFuncWithoutBuffer;
		parse_params = "nullptr, nullptr";
		}
	else if ( ref_type->incremental_input() )
		{
		parse_func = kParseFuncWithBuffer;
		parse_params = env->RValue(flow_buffer_id);
		}
	else
		{
		parse_func = kParseFuncWithoutBuffer;
		parse_params = strfmt("%s, %s", data.ptr_expr(), env->RValue(end_of_data));
		}

	if ( RequiresAnalyzerContext::compute(ref_type) )
		{
		parse_params += strfmt(", %s", env->RValue(analyzer_context_id));
		}

	if ( ref_type->RequiresByteOrder() )
		{
		env->Evaluate(out_cc, byteorder_id);
		parse_params += strfmt(", %s", env->RValue(byteorder_id));
		}

	string call_parse_func = strfmt("%s->%s(%s)",
	                                lvalue(), // parse() needs an LValue
	                                parse_func, parse_params.c_str());

	if ( incremental_input() )
		{
		if ( buffer_mode() == BUFFER_NOTHING )
			{
			out_cc->println("%s;", call_parse_func.c_str());
			out_cc->println("%s = true;", env->LValue(parsing_complete_var()));
			}
		else
			{
			ASSERT(parsing_complete_var());
			out_cc->println("%s = %s;", env->LValue(parsing_complete_var()),
			                call_parse_func.c_str());

			// parsing_complete_var might have been already
			// evaluated when set to false
			if ( ! env->Evaluated(parsing_complete_var()) )
				env->SetEvaluated(parsing_complete_var());
			}
		}
	else
		{
		if ( AddSizeVar(out_cc, env) )
			{
			out_cc->println("%s = %s;", env->LValue(size_var()), call_parse_func.c_str());
			env->SetEvaluated(size_var());
			}
		else
			{
			out_cc->println("%s;", call_parse_func.c_str());
			}
		}
	}